

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall
Parser::parseExpressionList
          (Parser *this,vector<Expression,_std::allocator<Expression>_> *list,int min,int max)

{
  bool bVar1;
  Tokenizer *pTVar2;
  Token *pTVar3;
  size_type sVar4;
  ulong uVar5;
  int local_94;
  Expression local_78;
  undefined1 local_50 [8];
  Expression exp;
  Token *start;
  int local_28;
  int iStack_24;
  bool valid;
  int max_local;
  int min_local;
  vector<Expression,_std::allocator<Expression>_> *list_local;
  Parser *this_local;
  
  local_28 = max;
  iStack_24 = min;
  _max_local = list;
  list_local = (vector<Expression,_std::allocator<Expression>_> *)this;
  std::vector<Expression,_std::allocator<Expression>_>::clear(list);
  if (local_28 < 0) {
    local_94 = 0x20;
  }
  else {
    local_94 = local_28;
  }
  std::vector<Expression,_std::allocator<Expression>_>::reserve(_max_local,(long)local_94);
  exp._16_8_ = peekToken(this,0);
  parseExpression((Expression *)local_50,this);
  std::vector<Expression,_std::allocator<Expression>_>::push_back(_max_local,(Expression *)local_50)
  ;
  bVar1 = Expression::isLoaded((Expression *)local_50);
  if (!bVar1) {
    printError<>(this,(Token *)exp._16_8_,"Parameter failure");
    pTVar2 = getTokenizer(this);
    Tokenizer::skipLookahead(pTVar2);
  }
  start._7_1_ = bVar1;
  while (pTVar3 = peekToken(this,0), pTVar3->type == Comma) {
    eatToken(this);
    parseExpression(&local_78,this);
    Expression::operator=((Expression *)local_50,&local_78);
    Expression::~Expression(&local_78);
    std::vector<Expression,_std::allocator<Expression>_>::push_back
              (_max_local,(Expression *)local_50);
    bVar1 = Expression::isLoaded((Expression *)local_50);
    if (!bVar1) {
      printError<>(this,(Token *)exp._16_8_,"Parameter failure");
      pTVar2 = getTokenizer(this);
      Tokenizer::skipLookahead(pTVar2);
      start._7_1_ = false;
    }
  }
  sVar4 = std::vector<Expression,_std::allocator<Expression>_>::size(_max_local);
  if (sVar4 < (ulong)(long)iStack_24) {
    printError<int>(this,(Token *)exp._16_8_,"Not enough parameters (min %d)",
                    &stack0xffffffffffffffdc);
    this_local._7_1_ = false;
  }
  else if ((local_28 == -1) ||
          (uVar5 = (ulong)local_28,
          sVar4 = std::vector<Expression,_std::allocator<Expression>_>::size(_max_local),
          sVar4 <= uVar5)) {
    this_local._7_1_ = start._7_1_;
  }
  else {
    printError<int>(this,(Token *)exp._16_8_,"Too many parameters (max %d)",&local_28);
    this_local._7_1_ = false;
  }
  Expression::~Expression((Expression *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Parser::parseExpressionList(std::vector<Expression>& list, int min, int max)
{
	bool valid = true;
	list.clear();
	list.reserve(max >= 0 ? max : 32);

	const Token& start = peekToken();

	Expression exp = parseExpression();
	list.push_back(exp);

	if (!exp.isLoaded())
	{
		printError(start, "Parameter failure");
		getTokenizer()->skipLookahead();
		valid = false;
	}

	while (peekToken().type == TokenType::Comma)
	{
		eatToken();

		exp = parseExpression();
		list.push_back(exp);

		if (!exp.isLoaded())
		{
			printError(start, "Parameter failure");
			getTokenizer()->skipLookahead();
			valid = false;
		}
	}

	if (list.size() < (size_t) min)
	{
		printError(start, "Not enough parameters (min %d)",min);
		return false;
	}

	if (max != -1 && (size_t) max < list.size())
	{
		printError(start, "Too many parameters (max %d)",max);
		return false;
	}

	return valid;
}